

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O1

bool __thiscall log_queue::push(log_queue *this,log_entry *f)

{
  iterator *piVar1;
  bool bVar2;
  _Map_pointer ppplVar3;
  _Map_pointer ppplVar4;
  _Elt_pointer pplVar5;
  _Elt_pointer pplVar6;
  _Elt_pointer pplVar7;
  _Elt_pointer pplVar8;
  unique_lock<std::mutex> lock;
  log_entry *local_40;
  unique_lock<std::mutex> local_38;
  
  local_38._M_device = &this->queue_mutex;
  local_38._M_owns = false;
  local_40 = f;
  std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  bVar2 = this->active;
  if (bVar2 == true) {
    ppplVar3 = (this->queue).c.
               super__Deque_base<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node;
    ppplVar4 = (this->queue).c.
               super__Deque_base<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    pplVar5 = (this->queue).c.
              super__Deque_base<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>.
              _M_impl.super__Deque_impl_data._M_start._M_last;
    pplVar6 = (this->queue).c.
              super__Deque_base<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    pplVar7 = (this->queue).c.
              super__Deque_base<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first;
    pplVar8 = (this->queue).c.
              super__Deque_base<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur;
    if (pplVar6 ==
        (this->queue).c.
        super__Deque_base<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<log_queue::log_entry*,std::allocator<log_queue::log_entry*>>::
      _M_push_back_aux<log_queue::log_entry*const&>
                ((deque<log_queue::log_entry*,std::allocator<log_queue::log_entry*>> *)this,
                 &local_40);
    }
    else {
      *pplVar6 = local_40;
      piVar1 = &(this->queue).c.
                super__Deque_base<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>.
                _M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    if (((long)pplVar5 - (long)pplVar8 >> 3) +
        ((long)pplVar6 - (long)pplVar7 >> 3) +
        ((((ulong)((long)ppplVar3 - (long)ppplVar4) >> 3) - 1) +
        (ulong)(ppplVar3 == (_Map_pointer)0x0)) * 0x40 == 0) {
      std::condition_variable::notify_one();
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  return bVar2;
}

Assistant:

bool push(log_entry* f) {
            std::unique_lock<std::mutex> lock(queue_mutex);

            if (active) {
                bool was_empty = (queue.size() == 0);
                queue.push(f);

                if (was_empty) {
                    wait_for_next_item_condition.notify_one();
                }

                return true;
            }

            return false;
        }